

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  size_t *this_00;
  bool bVar1;
  int32_t x;
  Shareability share;
  Const *value_00;
  element_type *peVar2;
  value_type *pvVar3;
  Expression *value_01;
  Iterator IVar4;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar5;
  bool local_329;
  bool local_2d1;
  Literal local_2b0;
  HeapType local_298;
  string local_290;
  string_view local_270;
  undefined8 local_260;
  int64_t u;
  value_type c;
  Iterator __end3;
  Iterator __begin3;
  Literals *__range3;
  stringstream wtf16;
  ostream local_1f8 [376];
  uintptr_t local_80;
  HeapType local_78;
  uintptr_t local_70;
  string_view local_68;
  uintptr_t local_58;
  Literal local_40;
  Type local_28;
  Type type;
  Literal *value_local;
  Builder *this_local;
  
  local_28.id = (value->type).id;
  type.id = (uintptr_t)value;
  bVar1 = Type::isNumber(&local_28);
  if (bVar1) {
    ::wasm::Literal::Literal(&local_40,value);
    this_local = (Builder *)makeConst(this,&local_40);
    ::wasm::Literal::~Literal(&local_40);
  }
  else {
    bVar1 = Literal::isNull(value);
    if (bVar1) {
      local_58 = (uintptr_t)Type::getHeapType(&local_28);
      this_local = (Builder *)makeRefNull(this,(HeapType)local_58);
    }
    else {
      bVar1 = Type::isFunction(&local_28);
      if (bVar1) {
        local_68 = (string_view)Literal::getFunc(value);
        local_70 = (uintptr_t)Type::getHeapType(&local_28);
        this_local = (Builder *)makeRefFunc(this,(Name)local_68,(HeapType)local_70);
      }
      else {
        bVar1 = Type::isRef(&local_28);
        local_2d1 = false;
        if (bVar1) {
          local_78 = Type::getHeapType(&local_28);
          local_2d1 = HeapType::isMaybeShared(&local_78,i31);
        }
        if (local_2d1 == false) {
          bVar1 = Type::isString(&local_28);
          if (bVar1) {
            std::__cxx11::stringstream::stringstream((stringstream *)&__range3);
            ::wasm::Literal::getGCData();
            this_00 = &__begin3.
                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                       .index;
            peVar2 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_00);
            std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)this_00);
            IVar4 = SmallVector<wasm::Literal,_1UL>::begin
                              ((SmallVector<wasm::Literal,_1UL> *)(peVar2 + 8));
            __begin3.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .parent = (SmallVector<wasm::Literal,_1UL> *)
                      IVar4.
                      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      .index;
            __end3.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .index = (size_t)IVar4.
                             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                             .parent;
            IVar5 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                     )SmallVector<wasm::Literal,_1UL>::end
                                ((SmallVector<wasm::Literal,_1UL> *)(peVar2 + 8));
            while( true ) {
              __end3.
              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              .parent = (SmallVector<wasm::Literal,_1UL> *)IVar5.index;
              c.type.id = (uintptr_t)IVar5.parent;
              bVar1 = SmallVector<wasm::Literal,_1UL>::
                      IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                    *)&__end3.
                                       super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                       .index,(Iterator *)&c.type);
              if (!bVar1) break;
              pvVar3 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                                 ((Iterator *)
                                  &__end3.
                                   super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                   .index);
              ::wasm::Literal::Literal((Literal *)&u,pvVar3);
              local_260 = ::wasm::Literal::getInteger();
              if (0xffff < local_260) {
                __assert_fail("u < 0x10000",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                              ,0x502,"Expression *wasm::Builder::makeConstantExpression(Literal)");
              }
              std::operator<<(local_1f8,(uchar)local_260);
              std::operator<<(local_1f8,local_260._1_1_);
              ::wasm::Literal::~Literal((Literal *)&u);
              SmallVector<wasm::Literal,_1UL>::
              IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                            *)&__end3.
                               super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                               .index);
              IVar5.index = (size_t)__end3.
                                    super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                    .parent;
              IVar5.parent = (SmallVector<wasm::Literal,_1UL> *)c.type.id;
            }
            std::__cxx11::stringstream::str();
            Name::Name((Name *)&local_270,&local_290);
            this_local = (Builder *)makeStringConst(this,(Name)local_270);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::stringstream::~stringstream((stringstream *)&__range3);
          }
          else {
            bVar1 = Type::isRef(&local_28);
            local_329 = false;
            if (bVar1) {
              local_298 = Type::getHeapType(&local_28);
              local_329 = HeapType::isMaybeShared(&local_298,ext);
            }
            if (local_329 == false) {
              bVar1 = Type::isTuple(&local_28);
              if (bVar1) {
                __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                              ,0x50d,"Expression *wasm::Builder::makeConstantExpression(Literal)");
              }
              bVar1 = Type::isBasic(&local_28);
              if (bVar1) {
                ::wasm::handle_unreachable
                          ("unsupported constant expression",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                           ,0x50e);
              }
              __assert_fail("type.isBasic() && \"TODO: handle compound types\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                            ,0x50d,"Expression *wasm::Builder::makeConstantExpression(Literal)");
            }
            ::wasm::Literal::internalize();
            value_01 = makeConstantExpression(this,&local_2b0);
            this_local = (Builder *)makeRefAs(this,ExternConvertAny,value_01);
            ::wasm::Literal::~Literal(&local_2b0);
          }
        }
        else {
          x = Literal::geti31(value,true);
          value_00 = makeConst<int>(this,x);
          local_80 = (uintptr_t)Type::getHeapType(&local_28);
          share = ::wasm::HeapType::getShared();
          this_local = (Builder *)makeRefI31(this,(Expression *)value_00,share);
        }
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type.getHeapType());
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::i31)) {
      return makeRefI31(makeConst(value.geti31()),
                        type.getHeapType().getShared());
    }
    if (type.isString()) {
      // The string is already WTF-16, but we need to convert from `Literals` to
      // actual string.
      std::stringstream wtf16;
      for (auto c : value.getGCData()->values) {
        auto u = c.getInteger();
        assert(u < 0x10000);
        wtf16 << uint8_t(u & 0xFF);
        wtf16 << uint8_t(u >> 8);
      }
      // TODO: Use wtf16.view() once we have C++20.
      return makeStringConst(wtf16.str());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::ext)) {
      return makeRefAs(ExternConvertAny,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }